

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>::
registerType<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,IFlyer,IWaterConsumer,Bird> *this,
          shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_>
          *instanceStorage)

{
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> local_30;
  shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>_> local_20;
  
  local_20.
  super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (instanceStorage->
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_20.
  super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (instanceStorage->
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_20.
      super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  addRegistration<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IWalker>
            (this,&local_20);
  if (local_20.
      super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_30.
  super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (instanceStorage->
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_30.
  super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (instanceStorage->
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  if (local_30.
      super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.
       super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  registerType<Bird,cinject::InstanceStorage<Bird,cinject::ConstructorFactory<Bird,void>>,IRunner,IJumper,IFlyer,IWaterConsumer,Bird>
            (this,&local_30);
  if (local_30.
      super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<cinject::InstanceStorage<Bird,_cinject::ConstructorFactory<Bird,_void>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }